

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.h
# Opt level: O2

Program * __thiscall skiwi::Program::operator=(Program *this,Program *param_1)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  
  std::
  vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
  ::_M_move_assign();
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell>_>_>
  ::operator=(&(this->quotes)._M_t,&(param_1->quotes)._M_t);
  bVar1 = param_1->assignable_variables_converted;
  bVar2 = param_1->define_converted;
  bVar3 = param_1->closure_converted;
  bVar4 = param_1->cps_converted;
  bVar5 = param_1->free_variables_analysed;
  bVar6 = param_1->linear_scan;
  bVar7 = param_1->linear_scan_indices_computed;
  bVar8 = param_1->lambda_to_let_converted;
  bVar9 = param_1->include_handled;
  bVar10 = param_1->simplified_to_core_forms;
  bVar11 = param_1->single_begin_conversion;
  bVar12 = param_1->tail_call_analysis;
  bVar13 = param_1->global_define_env_allocated;
  bVar14 = param_1->quotes_collected;
  bVar15 = param_1->quotes_converted;
  this->alpha_converted = param_1->alpha_converted;
  this->assignable_variables_converted = bVar1;
  this->define_converted = bVar2;
  this->closure_converted = bVar3;
  this->cps_converted = bVar4;
  this->free_variables_analysed = bVar5;
  this->linear_scan = bVar6;
  this->linear_scan_indices_computed = bVar7;
  this->lambda_to_let_converted = bVar8;
  this->include_handled = bVar9;
  this->simplified_to_core_forms = bVar10;
  this->single_begin_conversion = bVar11;
  this->tail_call_analysis = bVar12;
  this->global_define_env_allocated = bVar13;
  this->quotes_collected = bVar14;
  this->quotes_converted = bVar15;
  bVar1 = param_1->quotes_converted;
  bVar2 = param_1->quasiquotes_converted;
  bVar3 = param_1->inline_primitives_converted;
  bVar4 = param_1->constant_folded;
  bVar5 = param_1->constant_propagated;
  bVar6 = param_1->macros_expanded;
  bVar7 = param_1->single_begins_removed;
  this->quotes_collected = param_1->quotes_collected;
  this->quotes_converted = bVar1;
  this->quasiquotes_converted = bVar2;
  this->inline_primitives_converted = bVar3;
  this->constant_folded = bVar4;
  this->constant_propagated = bVar5;
  this->macros_expanded = bVar6;
  this->single_begins_removed = bVar7;
  return this;
}

Assistant:

Program()
      {
      alpha_converted = false;
      assignable_variables_converted = false;
      define_converted = false;
      closure_converted = false;
      cps_converted = false;
      free_variables_analysed = false;
      linear_scan_indices_computed = false;
      simplified_to_core_forms = false;
      single_begin_conversion = false;
      tail_call_analysis = false;
      global_define_env_allocated = false;
      quotes_collected = false;
      quotes_converted = false;      
      quasiquotes_converted = false;
      include_handled = false;
      lambda_to_let_converted = false;
      inline_primitives_converted = false;
      constant_folded = false;
      constant_propagated = false;
      macros_expanded = false;
      single_begins_removed = false;
      }